

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dac_control.c
# Opt level: O1

void daccontrol_update(void *info,UINT32 samples,DEV_SMPL **dummy)

{
  char cVar1;
  undefined1 uVar2;
  long lVar3;
  uint uVar4;
  ushort uVar5;
  byte bVar6;
  uint uVar7;
  code *pcVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  ushort uVar12;
  dac_control *chip;
  undefined8 uVar13;
  uint uVar14;
  ulong uVar15;
  
  if ((*(byte *)((long)info + 0x7c) & 0x81) == 1) {
    uVar4 = -(uint)*(byte *)((long)info + 0x98);
    if (*(char *)((long)info + 0x7d) == '\0') {
      uVar4 = (uint)*(byte *)((long)info + 0x98);
    }
    uVar15 = (ulong)samples * *(long *)((long)info + 0x80) + *(long *)((long)info + 0x88);
    *(ulong *)((long)info + 0x88) = uVar15 & 0xffffffff;
    uVar7 = *(uint *)((long)info + 0x90);
    uVar14 = (uint)(uVar15 >> 0x20);
    if (uVar7 < uVar14) {
      uVar14 = uVar7;
    }
    *(uint *)((long)info + 0x90) = uVar7 - uVar14;
    if (0x20 < uVar14) {
      *(int *)((long)info + 0x94) = *(int *)((long)info + 0x94) + (uVar14 - 0x10) * uVar4;
      uVar14 = 0x10;
    }
    for (; uVar14 != 0; uVar14 = uVar14 - 1) {
      uVar7 = *(int *)((long)info + 0x94) + *(int *)((long)info + 0x70);
      if (uVar7 < *(uint *)((long)info + 0x60)) {
        lVar3 = *(long *)((long)info + 0x68);
        uVar15 = (ulong)uVar7;
        cVar1 = *(char *)((long)info + 0x50);
        switch(cVar1) {
        case '\0':
          pcVar8 = *(code **)((long)info + 0x30);
          if (pcVar8 != (code *)0x0) {
            bVar9 = (byte)*(ushort *)((long)info + 0x52) & 0xf0;
            bVar6 = *(byte *)(lVar3 + uVar15) & 0xf;
            if ((*(ushort *)((long)info + 0x52) & 0x10) != 0) {
              uVar13 = *(undefined8 *)((long)info + 8);
              bVar6 = bVar6 | bVar9;
LAB_0011efb5:
              uVar12 = 0;
              goto LAB_0011efb7;
            }
            bVar10 = *(byte *)(lVar3 + uVar15) >> 4 | (*(byte *)(lVar3 + 1 + uVar15) & 3) << 4;
            (*pcVar8)(*(undefined8 *)((long)info + 8),0,bVar6 | bVar9);
            uVar13 = *(undefined8 *)((long)info + 8);
LAB_0011efd2:
            (**(code **)((long)info + 0x30))(uVar13,0,bVar10);
          }
          break;
        case '\x01':
        case '\x03':
        case '\x06':
        case '\t':
        case '\n':
        case '\v':
        case '\x0f':
        case '\x12':
          if (*(code **)((long)info + 0x30) != (code *)0x0) {
            bVar6 = *(byte *)(lVar3 + uVar15);
            (**(code **)((long)info + 0x30))
                      (*(undefined8 *)((long)info + 8),0,*(undefined1 *)((long)info + 0x52));
            uVar13 = *(undefined8 *)((long)info + 8);
            bVar10 = 1;
LAB_0011ed78:
            (**(code **)((long)info + 0x30))(uVar13,bVar10,bVar6);
          }
          break;
        case '\x02':
        case '\a':
        case '\b':
        case '\f':
        case '\r':
        case '\x0e':
        case '\x19':
          if (*(code **)((long)info + 0x30) != (code *)0x0) {
            bVar6 = *(byte *)(lVar3 + uVar15);
            uVar12 = *(ushort *)((long)info + 0x52) >> 7;
            (**(code **)((long)info + 0x30))
                      (*(undefined8 *)((long)info + 8),uVar12 & 0xfe,
                       (char)*(ushort *)((long)info + 0x52));
            uVar13 = *(undefined8 *)((long)info + 8);
            bVar10 = (byte)uVar12 | 1;
            goto LAB_0011ed78;
          }
          break;
        case '\x04':
        case '\x10':
        case '\x15':
        case '%':
          break;
        case '\x05':
        case '\x1b':
          if (*(code **)((long)info + 0x30) != (code *)0x0) {
            uVar12 = *(ushort *)((long)info + 0x52);
            uVar5 = uVar12 >> 8;
            uVar2 = *(undefined1 *)(lVar3 + uVar15);
            if (uVar5 == 0xff) {
              (**(code **)((long)info + 0x30))(*(undefined8 *)((long)info + 8),uVar12 & 0xf,uVar2);
            }
            else {
              bVar6 = (byte)(uVar12 >> 8);
              if (cVar1 == '\x1b') {
                bVar6 = (**(code **)((long)info + 0x10))(*(undefined8 *)((long)info + 8),0);
              }
              bVar10 = (byte)uVar12 >> 4;
              (**(code **)((long)info + 0x30))(*(undefined8 *)((long)info + 8),bVar10,uVar5);
              (**(code **)((long)info + 0x30))(*(undefined8 *)((long)info + 8),uVar12 & 0xf,uVar2);
              if (uVar5 != bVar6) {
                uVar13 = *(undefined8 *)((long)info + 8);
                goto LAB_0011ed78;
              }
            }
          }
          break;
        case '\x11':
          pcVar8 = *(code **)((long)info + 0x38);
          if (pcVar8 != (code *)0x0) {
            uVar7 = (uint)*(byte *)(lVar3 + uVar15) | (*(byte *)(lVar3 + 1 + uVar15) & 0xf) << 8;
            uVar13 = *(undefined8 *)((long)info + 8);
            uVar12 = *(ushort *)((long)info + 0x52) & 0xf;
LAB_0011edd2:
            (*pcVar8)(uVar13,uVar12,uVar7);
          }
          break;
        case '\x13':
        case '\x14':
        case '\x16':
        case '\x17':
        case '\x1d':
        case '\x1e':
        case '$':
        case '(':
        case ')':
          pcVar8 = *(code **)((long)info + 0x30);
          if (pcVar8 != (code *)0x0) {
            uVar12 = (ushort)*(byte *)((long)info + 0x52);
            uVar7 = (uint)*(byte *)(lVar3 + uVar15);
            uVar13 = *(undefined8 *)((long)info + 8);
            goto LAB_0011edd2;
          }
          break;
        case '\x18':
          pcVar8 = *(code **)((long)info + 0x30);
          if (pcVar8 != (code *)0x0) {
            uVar12 = *(ushort *)((long)info + 0x52);
            bVar6 = *(byte *)(lVar3 + uVar15);
            if ((char)uVar12 == '\0') {
              bVar10 = (byte)(uVar12 >> 8);
              if ((char)bVar6 < '\0') {
                (*pcVar8)(*(undefined8 *)((long)info + 8),0,bVar6);
                uVar13 = *(undefined8 *)((long)info + 8);
                bVar10 = bVar10 << 4;
                goto LAB_0011efd2;
              }
              uVar13 = *(undefined8 *)((long)info + 8);
              bVar6 = (bVar10 & 0xf) << 3;
              goto LAB_0011efb5;
            }
            uVar13 = *(undefined8 *)((long)info + 8);
            uVar12 = uVar12 & 0xff;
LAB_0011efb7:
            (*pcVar8)(uVar13,uVar12,bVar6);
          }
          break;
        case '\x1a':
        case '\x1c':
        case ' ':
        case '\"':
        case '&':
        case '\'':
switchD_0011ecea_caseD_1a:
          pcVar8 = *(code **)((long)info + 0x40);
          if (pcVar8 != (code *)0x0) {
            uVar7 = (uint)*(byte *)(lVar3 + uVar15);
            uVar13 = *(undefined8 *)((long)info + 8);
            uVar12 = *(ushort *)((long)info + 0x52);
            goto LAB_0011edd2;
          }
          break;
        case '\x1f':
          if (*(code **)((long)info + 0x30) != (code *)0x0) {
            bVar6 = *(byte *)((long)info + 0x52);
            (**(code **)((long)info + 0x30))
                      (*(undefined8 *)((long)info + 8),0,*(undefined1 *)(lVar3 + uVar15));
            (**(code **)((long)info + 0x30))
                      (*(undefined8 *)((long)info + 8),1,*(undefined1 *)(lVar3 + 1 + uVar15));
            uVar13 = *(undefined8 *)((long)info + 8);
            bVar10 = 2;
            goto LAB_0011ed78;
          }
          break;
        case '!':
          pcVar8 = *(code **)((long)info + 0x30);
          if (pcVar8 != (code *)0x0) {
            uVar7 = (uint)*(byte *)(lVar3 + uVar15);
            uVar13 = *(undefined8 *)((long)info + 8);
            uVar12 = (ushort)(byte)(*(char *)((long)info + 0x52) + 0x80);
            goto LAB_0011edd2;
          }
          break;
        case '#':
          if (*(code **)((long)info + 0x30) != (code *)0x0) {
            bVar6 = *(byte *)(lVar3 + uVar15);
            (**(code **)((long)info + 0x30))
                      (*(undefined8 *)((long)info + 8),1,*(undefined1 *)((long)info + 0x52));
            uVar13 = *(undefined8 *)((long)info + 8);
            bVar10 = 0;
            goto LAB_0011ed78;
          }
          break;
        default:
          if (cVar1 == -0x80) goto switchD_0011ecea_caseD_1a;
        }
      }
      *(int *)((long)info + 0x94) = *(int *)((long)info + 0x94) + uVar4;
    }
    if ((*(int *)((long)info + 0x90) == 0) && ((*(byte *)((long)info + 0x7c) & 4) != 0)) {
      *(int *)((long)info + 0x90) = *(int *)((long)info + 0x78);
      if (*(char *)((long)info + 0x7d) == '\0') {
        iVar11 = 0;
      }
      else {
        iVar11 = (uint)*(byte *)((long)info + 0x98) * (*(int *)((long)info + 0x78) + -1);
      }
      *(int *)((long)info + 0x94) = iVar11;
    }
    if (*(int *)((long)info + 0x90) == 0) {
      *(byte *)((long)info + 0x7c) = *(byte *)((long)info + 0x7c) & 0xfe;
    }
  }
  return;
}

Assistant:

void daccontrol_update(void* info, UINT32 samples, DEV_SMPL** dummy)
{
	dac_control* chip = (dac_control*)info;
	INT32 RealDataStp;
	UINT32 cmdsToProc;
	
	if (chip->Running & 0x80)	// disabled
		return;
	if (! (chip->Running & 0x01))	// stopped
		return;
	
	RealDataStp = (chip->Reverse) ? -chip->DataStep : +chip->DataStep;
	
	RC_STEPS(&chip->stepCntr, samples);
	cmdsToProc = RC_GET_VAL(&chip->stepCntr);
	RC_MASK(&chip->stepCntr);
	
	if (cmdsToProc > chip->RemainCmds)
		cmdsToProc = chip->RemainCmds;
	chip->RemainCmds -= cmdsToProc;
	
	if (cmdsToProc > 0x20)
	{
		// very effective Speed Hack for fast seeking
		chip->RealPos += RealDataStp * (cmdsToProc - 0x10);
		cmdsToProc = 0x10;
	}
	
	for (; cmdsToProc > 0; cmdsToProc --)
	{
		daccontrol_SendCommand(chip);
		chip->RealPos += RealDataStp;
	}
	
	if (! chip->RemainCmds && (chip->Running & 0x04))
	{
		// loop back to start
		chip->RemainCmds = chip->CmdsToSend;
		if (! chip->Reverse)
			chip->RealPos = 0x00;
		else
			chip->RealPos = (chip->CmdsToSend - 1) * chip->DataStep;
	}
	
	if (! chip->RemainCmds)
		chip->Running &= ~0x01;	// stop
	
	return;
}